

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O3

kexinit_algorithm * ssh2_kexinit_addalg(kexinit_algorithm_list *list,char *name)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  kexinit_algorithm *pkVar4;
  ulong oldlen;
  long lVar5;
  ulong uVar6;
  ptrlen pl2;
  ptrlen pl1;
  
  sVar3 = strlen(name);
  if (list->nalgs == 0) {
    oldlen = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pl2.len = sVar3;
      pl2.ptr = name;
      pl1.len = *(size_t *)((long)&(list->algs->name).len + lVar5);
      pl1.ptr = *(void **)((long)&(list->algs->name).ptr + lVar5);
      _Var2 = ptrlen_eq_ptrlen(pl1,pl2);
      if (_Var2) {
        return (kexinit_algorithm *)((long)&(list->algs->name).ptr + lVar5);
      }
      uVar6 = uVar6 + 1;
      oldlen = list->nalgs;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < oldlen);
  }
  pkVar4 = (kexinit_algorithm *)safegrowarray(list->algs,&list->algsize,0x20,oldlen,1,false);
  list->algs = pkVar4;
  sVar1 = list->nalgs;
  list->nalgs = sVar1 + 1;
  pkVar4[sVar1].name.ptr = name;
  pkVar4[sVar1].name.len = sVar3;
  return pkVar4 + sVar1;
}

Assistant:

static struct kexinit_algorithm *ssh2_kexinit_addalg(
    struct kexinit_algorithm_list *list, const char *name)
{
    return ssh2_kexinit_addalg_pl(list, ptrlen_from_asciz(name));
}